

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_70::crashHandler(anon_unknown_70 *this,int signo,siginfo_t *info,void *context)

{
  ArrayPtr<void_*const> trace_00;
  ArrayPtr<void_*const> trace_01;
  ArrayPtr<void_*> space;
  char *in_stack_fffffffffffffdc0;
  ArrayPtr<unsigned_char> local_208;
  ArrayPtr<const_unsigned_char> local_1f8;
  FdOutputStream local_1e8;
  undefined1 local_1d5 [37];
  String local_1b0;
  kj *local_198;
  void **ppvStack_190;
  String local_180;
  char *local_168;
  undefined1 local_160 [8];
  String message;
  void **local_140;
  kj *pkStack_138;
  ArrayPtr<void_*const> trace;
  void *traceSpace [32];
  void *context_local;
  siginfo_t *info_local;
  int signo_local;
  
  info_local._4_4_ = (int)this;
  trace.size_ = 0;
  ArrayPtr<void*>::ArrayPtr<32ul>
            ((ArrayPtr<void*> *)&message.content.disposer,(void *(*) [32])&trace.size_);
  space.size_ = 2;
  space.ptr = local_140;
  trace_00 = getStackTrace((kj *)message.content.disposer,space,(uint)context);
  local_168 = strsignal(info_local._4_4_);
  pkStack_138 = (kj *)trace_00.ptr;
  trace.ptr = (void **)trace_00.size_;
  local_198 = pkStack_138;
  ppvStack_190 = trace.ptr;
  trace_01.size_ = (size_t)context;
  trace_01.ptr = trace.ptr;
  stringifyStackTraceAddresses(&local_180,pkStack_138,trace_01);
  local_1d5._13_8_ = pkStack_138;
  local_1d5._21_8_ = trace.ptr;
  stringifyStackTrace(&local_1b0,trace_00);
  local_1d5[0] = 10;
  str<char_const(&)[22],int&,char_const(&)[3],char*,char_const(&)[9],kj::String,kj::String,char>
            ((String *)local_160,(kj *)"*** Received signal #",
             (char (*) [22])((long)&info_local + 4),(int *)0x399f65,(char (*) [3])&local_168,
             (char **)0x3c3811,(char (*) [9])&local_180,&local_1b0,(String *)local_1d5,
             in_stack_fffffffffffffdc0);
  String::~String(&local_1b0);
  String::~String(&local_180);
  FdOutputStream::FdOutputStream(&local_1e8,2);
  local_208 = String::asBytes((String *)local_160);
  local_1f8 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_208);
  FdOutputStream::write(&local_1e8,(int)local_1f8.ptr,(void *)local_1f8.size_,(size_t)local_1f8.ptr)
  ;
  FdOutputStream::~FdOutputStream(&local_1e8);
  _exit(1);
}

Assistant:

[[noreturn]] void crashHandler(int signo, siginfo_t* info, void* context) {
  void* traceSpace[32]{};

#if KJ_USE_WIN32_DBGHELP
  // Win32 backtracing can't trace its way out of a Cygwin signal handler. However, Cygwin gives
  // us direct access to the CONTEXT, which we can pass to the Win32 tracing functions.
  ucontext_t* ucontext = reinterpret_cast<ucontext_t*>(context);
  // Cygwin's mcontext_t has the same layout as CONTEXT.
  // TODO(someday): Figure out why this produces garbage for SIGINT from ctrl+C. It seems to work
  //   correctly for SIGSEGV.
  CONTEXT win32Context;
  static_assert(sizeof(ucontext->uc_mcontext) >= sizeof(win32Context),
      "mcontext_t should be an extension of CONTEXT");
  memcpy(&win32Context, &ucontext->uc_mcontext, sizeof(win32Context));
  auto trace = getStackTrace(traceSpace, 0, GetCurrentThread(), win32Context);
#else
  // ignoreCount = 2 to ignore crashHandler() and signal trampoline.
  auto trace = getStackTrace(traceSpace, 2);
#endif

  auto message = kj::str("*** Received signal #", signo, ": ", strsignal(signo),
                         "\nstack: ", stringifyStackTraceAddresses(trace),
                         stringifyStackTrace(trace), '\n');

  FdOutputStream(STDERR_FILENO).write(message.asBytes());
  _exit(1);
}